

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::BatchNorm_x86_avx512::forward_inplace
          (BatchNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  _func_int **pp_Var7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  undefined1 (*pauVar26) [64];
  int iVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  undefined1 (*pauVar34) [64];
  ulong uVar35;
  undefined1 (*pauVar36) [64];
  uint uVar37;
  ulong uVar38;
  ushort uVar39;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  
  iVar3 = bottom_top_blob->elempack;
  iVar28 = bottom_top_blob->dims;
  iVar4 = bottom_top_blob->w;
  uVar25 = bottom_top_blob->h;
  iVar5 = bottom_top_blob->d;
  uVar6 = bottom_top_blob->c;
  if (iVar28 == 2) {
    if (0 < (int)uVar25) {
      uVar33 = iVar3 * iVar4;
      pp_Var7 = this->_vptr_BatchNorm_x86_avx512;
      uVar38 = 0;
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        lVar32 = *(long *)(&this->field_0x1f8 + (long)pp_Var7[-3]);
        uVar37 = *(uint *)(lVar32 + uVar38 * 4);
        if (iVar3 == 4) {
          auVar47 = *(undefined1 (*) [16])(lVar32 + uVar38 * 0x10);
        }
        else {
          auVar47._4_4_ = uVar37;
          auVar47._0_4_ = uVar37;
          auVar47._8_4_ = uVar37;
          auVar47._12_4_ = uVar37;
        }
        lVar8 = *(long *)(&this->field_0x240 + (long)pp_Var7[-3]);
        uVar30 = *(uint *)(lVar8 + uVar38 * 4);
        if (iVar3 == 4) {
          auVar49 = *(undefined1 (*) [16])(lVar8 + uVar38 * 0x10);
        }
        else {
          auVar49._4_4_ = uVar30;
          auVar49._0_4_ = uVar30;
          auVar49._8_4_ = uVar30;
          auVar49._12_4_ = uVar30;
        }
        if (iVar3 == 8) {
          auVar51 = *(undefined1 (*) [32])(lVar32 + uVar38 * 0x20);
        }
        else {
          auVar51._16_16_ = auVar47;
          auVar51._0_16_ = auVar47;
        }
        if (iVar3 == 8) {
          auVar53 = *(undefined1 (*) [32])(lVar8 + uVar38 * 0x20);
        }
        else {
          auVar53._16_16_ = auVar49;
          auVar53._0_16_ = auVar49;
        }
        if (iVar3 == 0x10) {
          auVar43 = *(undefined1 (*) [64])(lVar32 + uVar38 * 0x40);
          auVar44 = *(undefined1 (*) [64])(lVar8 + uVar38 * 0x40);
        }
        else {
          auVar43 = vinsertf64x4_avx512f(ZEXT3264(auVar51),auVar51,1);
          auVar44 = vinsertf64x4_avx512f(ZEXT3264(auVar53),auVar53,1);
        }
        pauVar34 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar38 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar29 = 0;
        if (0xf < (int)uVar33) {
          iVar27 = 0xf;
          do {
            auVar42 = vfmadd132ps_avx512f(*pauVar34,auVar43,auVar44);
            *pauVar34 = auVar42;
            pauVar34 = pauVar34 + 1;
            iVar27 = iVar27 + 0x10;
            uVar29 = uVar33 & 0xfffffff0;
          } while (iVar27 < (int)uVar33);
        }
        uVar31 = uVar29 | 7;
        while ((int)uVar31 < (int)uVar33) {
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar34,auVar51,auVar53);
          *(undefined1 (*) [32])*pauVar34 = ZEXT1632(auVar48);
          pauVar34 = (undefined1 (*) [64])(*pauVar34 + 0x20);
          uVar31 = uVar29 + 0xf;
          uVar29 = uVar29 + 8;
        }
        uVar31 = uVar29 | 3;
        while ((int)uVar31 < (int)uVar33) {
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar34,auVar47,auVar49);
          *(undefined1 (*) [16])*pauVar34 = auVar48;
          pauVar34 = (undefined1 (*) [64])(*pauVar34 + 0x10);
          uVar31 = uVar29 + 7;
          uVar29 = uVar29 + 4;
        }
        if ((int)uVar29 < (int)uVar33) {
          auVar43 = vpbroadcastq_avx512f();
          auVar44 = vbroadcastss_avx512f(ZEXT416(uVar30));
          auVar42 = vbroadcastss_avx512f(ZEXT416(uVar37));
          uVar35 = 0;
          do {
            auVar45 = vpbroadcastq_avx512f();
            auVar46 = vporq_avx512f(auVar45,auVar40);
            auVar45 = vporq_avx512f(auVar45,auVar41);
            uVar22 = vpcmpuq_avx512f(auVar45,auVar43,2);
            bVar23 = (byte)uVar22;
            uVar22 = vpcmpuq_avx512f(auVar46,auVar43,2);
            bVar24 = (byte)uVar22;
            uVar39 = CONCAT11(bVar24,bVar23);
            piVar1 = (int *)(*pauVar34 + uVar35 * 4);
            auVar45._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * piVar1[1];
            auVar45._0_4_ = (uint)(bVar23 & 1) * *piVar1;
            auVar45._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * piVar1[2];
            auVar45._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * piVar1[3];
            auVar45._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * piVar1[4];
            auVar45._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * piVar1[5];
            auVar45._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * piVar1[6];
            auVar45._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * piVar1[7];
            auVar45._32_4_ = (uint)(bVar24 & 1) * piVar1[8];
            auVar45._36_4_ = (uint)(bVar24 >> 1 & 1) * piVar1[9];
            auVar45._40_4_ = (uint)(bVar24 >> 2 & 1) * piVar1[10];
            auVar45._44_4_ = (uint)(bVar24 >> 3 & 1) * piVar1[0xb];
            auVar45._48_4_ = (uint)(bVar24 >> 4 & 1) * piVar1[0xc];
            auVar45._52_4_ = (uint)(bVar24 >> 5 & 1) * piVar1[0xd];
            auVar45._56_4_ = (uint)(bVar24 >> 6 & 1) * piVar1[0xe];
            auVar45._60_4_ = (uint)(bVar24 >> 7) * piVar1[0xf];
            auVar45 = vfmadd213ps_avx512f(auVar45,auVar44,auVar42);
            puVar2 = (uint *)(*pauVar34 + uVar35 * 4);
            bVar9 = (bool)((byte)(uVar39 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar39 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar39 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar39 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
            bVar15 = (bool)((byte)(uVar39 >> 7) & 1);
            bVar16 = (bool)(bVar24 >> 1 & 1);
            bVar17 = (bool)(bVar24 >> 2 & 1);
            bVar18 = (bool)(bVar24 >> 3 & 1);
            bVar19 = (bool)(bVar24 >> 4 & 1);
            bVar20 = (bool)(bVar24 >> 5 & 1);
            bVar21 = (bool)(bVar24 >> 6 & 1);
            *puVar2 = (uint)(bVar23 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar23 & 1) * *puVar2;
            puVar2[1] = (uint)bVar9 * auVar45._4_4_ | (uint)!bVar9 * puVar2[1];
            puVar2[2] = (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * puVar2[2];
            puVar2[3] = (uint)bVar11 * auVar45._12_4_ | (uint)!bVar11 * puVar2[3];
            puVar2[4] = (uint)bVar12 * auVar45._16_4_ | (uint)!bVar12 * puVar2[4];
            puVar2[5] = (uint)bVar13 * auVar45._20_4_ | (uint)!bVar13 * puVar2[5];
            puVar2[6] = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * puVar2[6];
            puVar2[7] = (uint)bVar15 * auVar45._28_4_ | (uint)!bVar15 * puVar2[7];
            puVar2[8] = (uint)(bVar24 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar24 & 1) * puVar2[8];
            puVar2[9] = (uint)bVar16 * auVar45._36_4_ | (uint)!bVar16 * puVar2[9];
            puVar2[10] = (uint)bVar17 * auVar45._40_4_ | (uint)!bVar17 * puVar2[10];
            puVar2[0xb] = (uint)bVar18 * auVar45._44_4_ | (uint)!bVar18 * puVar2[0xb];
            puVar2[0xc] = (uint)bVar19 * auVar45._48_4_ | (uint)!bVar19 * puVar2[0xc];
            puVar2[0xd] = (uint)bVar20 * auVar45._52_4_ | (uint)!bVar20 * puVar2[0xd];
            puVar2[0xe] = (uint)bVar21 * auVar45._56_4_ | (uint)!bVar21 * puVar2[0xe];
            puVar2[0xf] = (uint)(bVar24 >> 7) * auVar45._60_4_ |
                          (uint)!(bool)(bVar24 >> 7) * puVar2[0xf];
            uVar35 = uVar35 + 0x10;
          } while (((ulong)(~uVar29 + uVar33) + 0x10 & 0x1fffffff0) != uVar35);
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 != uVar25);
    }
  }
  else if (iVar28 == 1) {
    pauVar34 = (undefined1 (*) [64])bottom_top_blob->data;
    pauVar26 = *(undefined1 (**) [64])
                (&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx512[-3]);
    pauVar36 = *(undefined1 (**) [64])
                (&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx512[-3]);
    uVar37 = iVar3 * iVar4;
    uVar33 = 0;
    if (0xf < (int)uVar37) {
      uVar33 = uVar37 & 0x7ffffff0;
      iVar27 = 0xf;
      do {
        auVar40 = vfmadd213ps_avx512f(*pauVar36,*pauVar34,*pauVar26);
        *pauVar34 = auVar40;
        pauVar34 = pauVar34 + 1;
        pauVar26 = pauVar26 + 1;
        pauVar36 = pauVar36 + 1;
        iVar27 = iVar27 + 0x10;
      } while (iVar27 < (int)uVar37);
    }
    uVar30 = uVar33 | 7;
    while ((int)uVar30 < (int)uVar37) {
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])*pauVar36,*(undefined1 (*) [32])*pauVar34,
                                *(undefined1 (*) [32])*pauVar26);
      *(undefined1 (*) [32])*pauVar34 = ZEXT1632(auVar47);
      pauVar34 = (undefined1 (*) [64])(*pauVar34 + 0x20);
      pauVar26 = (undefined1 (*) [64])(*pauVar26 + 0x20);
      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x20);
      uVar30 = uVar33 + 0xf;
      uVar33 = uVar33 + 8;
    }
    uVar30 = uVar33 | 3;
    while ((int)uVar30 < (int)uVar37) {
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar36,*(undefined1 (*) [16])*pauVar34,
                                *(undefined1 (*) [16])*pauVar26);
      *(undefined1 (*) [16])*pauVar34 = auVar47;
      pauVar34 = (undefined1 (*) [64])(*pauVar34 + 0x10);
      pauVar26 = (undefined1 (*) [64])(*pauVar26 + 0x10);
      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
      uVar30 = uVar33 + 7;
      uVar33 = uVar33 + 4;
    }
    if (uVar37 - uVar33 != 0 && (int)uVar33 <= (int)uVar37) {
      lVar32 = 0;
      do {
        auVar47 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar34 + lVar32 * 4)),
                                  ZEXT416(*(uint *)(*pauVar36 + lVar32 * 4)),
                                  ZEXT416(*(uint *)(*pauVar26 + lVar32 * 4)));
        *(int *)(*pauVar34 + lVar32 * 4) = auVar47._0_4_;
        lVar32 = lVar32 + 1;
      } while (uVar37 - uVar33 != (int)lVar32);
    }
  }
  if ((iVar28 - 3U < 2) && (0 < (int)uVar6)) {
    uVar25 = iVar4 * iVar3 * uVar25 * iVar5;
    pp_Var7 = this->_vptr_BatchNorm_x86_avx512;
    uVar38 = 0;
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      lVar32 = *(long *)(&this->field_0x1f8 + (long)pp_Var7[-3]);
      uVar33 = *(uint *)(lVar32 + uVar38 * 4);
      if (iVar3 == 4) {
        auVar48 = *(undefined1 (*) [16])(lVar32 + uVar38 * 0x10);
      }
      else {
        auVar48._4_4_ = uVar33;
        auVar48._0_4_ = uVar33;
        auVar48._8_4_ = uVar33;
        auVar48._12_4_ = uVar33;
      }
      lVar8 = *(long *)(&this->field_0x240 + (long)pp_Var7[-3]);
      uVar37 = *(uint *)(lVar8 + uVar38 * 4);
      if (iVar3 == 4) {
        auVar50 = *(undefined1 (*) [16])(lVar8 + uVar38 * 0x10);
      }
      else {
        auVar50._4_4_ = uVar37;
        auVar50._0_4_ = uVar37;
        auVar50._8_4_ = uVar37;
        auVar50._12_4_ = uVar37;
      }
      if (iVar3 == 8) {
        auVar52 = *(undefined1 (*) [32])(lVar32 + uVar38 * 0x20);
      }
      else {
        auVar52._16_16_ = auVar48;
        auVar52._0_16_ = auVar48;
      }
      if (iVar3 == 8) {
        auVar54 = *(undefined1 (*) [32])(lVar8 + uVar38 * 0x20);
      }
      else {
        auVar54._16_16_ = auVar50;
        auVar54._0_16_ = auVar50;
      }
      if (iVar3 == 0x10) {
        auVar43 = *(undefined1 (*) [64])(lVar32 + uVar38 * 0x40);
        auVar44 = *(undefined1 (*) [64])(lVar8 + uVar38 * 0x40);
      }
      else {
        auVar43 = vinsertf64x4_avx512f(ZEXT3264(auVar52),auVar52,1);
        auVar44 = vinsertf64x4_avx512f(ZEXT3264(auVar54),auVar54,1);
      }
      pauVar34 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * uVar38 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar30 = 0;
      if (0xf < (int)uVar25) {
        iVar28 = 0xf;
        do {
          auVar42 = vfmadd132ps_avx512f(*pauVar34,auVar43,auVar44);
          *pauVar34 = auVar42;
          pauVar34 = pauVar34 + 1;
          iVar28 = iVar28 + 0x10;
          uVar30 = uVar25 & 0xfffffff0;
        } while (iVar28 < (int)uVar25);
      }
      uVar29 = uVar30 | 7;
      while ((int)uVar29 < (int)uVar25) {
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar34,auVar52,auVar54);
        *(undefined1 (*) [32])*pauVar34 = ZEXT1632(auVar47);
        pauVar34 = (undefined1 (*) [64])(*pauVar34 + 0x20);
        uVar29 = uVar30 + 0xf;
        uVar30 = uVar30 + 8;
      }
      uVar29 = uVar30 | 3;
      while ((int)uVar29 < (int)uVar25) {
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar34,auVar48,auVar50);
        *(undefined1 (*) [16])*pauVar34 = auVar47;
        pauVar34 = (undefined1 (*) [64])(*pauVar34 + 0x10);
        uVar29 = uVar30 + 7;
        uVar30 = uVar30 + 4;
      }
      if ((int)uVar30 < (int)uVar25) {
        auVar43 = vpbroadcastq_avx512f();
        auVar44 = vbroadcastss_avx512f(ZEXT416(uVar37));
        auVar42 = vbroadcastss_avx512f(ZEXT416(uVar33));
        uVar35 = 0;
        do {
          auVar45 = vpbroadcastq_avx512f();
          auVar46 = vporq_avx512f(auVar45,auVar40);
          auVar45 = vporq_avx512f(auVar45,auVar41);
          uVar22 = vpcmpuq_avx512f(auVar45,auVar43,2);
          bVar23 = (byte)uVar22;
          uVar22 = vpcmpuq_avx512f(auVar46,auVar43,2);
          bVar24 = (byte)uVar22;
          uVar39 = CONCAT11(bVar24,bVar23);
          piVar1 = (int *)(*pauVar34 + uVar35 * 4);
          auVar46._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * piVar1[1];
          auVar46._0_4_ = (uint)(bVar23 & 1) * *piVar1;
          auVar46._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * piVar1[2];
          auVar46._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * piVar1[3];
          auVar46._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * piVar1[4];
          auVar46._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * piVar1[5];
          auVar46._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * piVar1[6];
          auVar46._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * piVar1[7];
          auVar46._32_4_ = (uint)(bVar24 & 1) * piVar1[8];
          auVar46._36_4_ = (uint)(bVar24 >> 1 & 1) * piVar1[9];
          auVar46._40_4_ = (uint)(bVar24 >> 2 & 1) * piVar1[10];
          auVar46._44_4_ = (uint)(bVar24 >> 3 & 1) * piVar1[0xb];
          auVar46._48_4_ = (uint)(bVar24 >> 4 & 1) * piVar1[0xc];
          auVar46._52_4_ = (uint)(bVar24 >> 5 & 1) * piVar1[0xd];
          auVar46._56_4_ = (uint)(bVar24 >> 6 & 1) * piVar1[0xe];
          auVar46._60_4_ = (uint)(bVar24 >> 7) * piVar1[0xf];
          auVar45 = vfmadd213ps_avx512f(auVar46,auVar44,auVar42);
          puVar2 = (uint *)(*pauVar34 + uVar35 * 4);
          bVar9 = (bool)((byte)(uVar39 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar39 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar39 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar39 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar39 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
          bVar15 = (bool)((byte)(uVar39 >> 7) & 1);
          bVar16 = (bool)(bVar24 >> 1 & 1);
          bVar17 = (bool)(bVar24 >> 2 & 1);
          bVar18 = (bool)(bVar24 >> 3 & 1);
          bVar19 = (bool)(bVar24 >> 4 & 1);
          bVar20 = (bool)(bVar24 >> 5 & 1);
          bVar21 = (bool)(bVar24 >> 6 & 1);
          *puVar2 = (uint)(bVar23 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar23 & 1) * *puVar2;
          puVar2[1] = (uint)bVar9 * auVar45._4_4_ | (uint)!bVar9 * puVar2[1];
          puVar2[2] = (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * puVar2[2];
          puVar2[3] = (uint)bVar11 * auVar45._12_4_ | (uint)!bVar11 * puVar2[3];
          puVar2[4] = (uint)bVar12 * auVar45._16_4_ | (uint)!bVar12 * puVar2[4];
          puVar2[5] = (uint)bVar13 * auVar45._20_4_ | (uint)!bVar13 * puVar2[5];
          puVar2[6] = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * puVar2[6];
          puVar2[7] = (uint)bVar15 * auVar45._28_4_ | (uint)!bVar15 * puVar2[7];
          puVar2[8] = (uint)(bVar24 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar24 & 1) * puVar2[8];
          puVar2[9] = (uint)bVar16 * auVar45._36_4_ | (uint)!bVar16 * puVar2[9];
          puVar2[10] = (uint)bVar17 * auVar45._40_4_ | (uint)!bVar17 * puVar2[10];
          puVar2[0xb] = (uint)bVar18 * auVar45._44_4_ | (uint)!bVar18 * puVar2[0xb];
          puVar2[0xc] = (uint)bVar19 * auVar45._48_4_ | (uint)!bVar19 * puVar2[0xc];
          puVar2[0xd] = (uint)bVar20 * auVar45._52_4_ | (uint)!bVar20 * puVar2[0xd];
          puVar2[0xe] = (uint)bVar21 * auVar45._56_4_ | (uint)!bVar21 * puVar2[0xe];
          puVar2[0xf] = (uint)(bVar24 >> 7) * auVar45._60_4_ |
                        (uint)!(bool)(bVar24 >> 7) * puVar2[0xf];
          uVar35 = uVar35 + 0x10;
        } while (((ulong)(~uVar30 + uVar25) + 0x10 & 0x1fffffff0) != uVar35);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != uVar6);
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}